

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::anon_unknown_1::TestGroup::~TestGroup(TestGroup *this)

{
  std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::~vector
            (&this->m_matches);
  std::
  _Rb_tree<const_Catch::TestCase_*,_const_Catch::TestCase_*,_std::_Identity<const_Catch::TestCase_*>,_std::less<const_Catch::TestCase_*>,_std::allocator<const_Catch::TestCase_*>_>
  ::~_Rb_tree(&(this->m_tests)._M_t);
  RunContext::~RunContext(&this->m_context);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

explicit TestGroup(std::shared_ptr<Config> const& config)
            : m_config{config}
            , m_context{config, makeReporter(config)}
            {
                auto const& allTestCases = getAllTestCasesSorted(*m_config);
                m_matches = m_config->testSpec().matchesByFilter(allTestCases, *m_config);
                auto const& invalidArgs = m_config->testSpec().getInvalidArgs();

                if (m_matches.empty() && invalidArgs.empty()) {
                    for (auto const& test : allTestCases)
                        if (!test.isHidden())
                            m_tests.emplace(&test);
                } else {
                    for (auto const& match : m_matches)
                        m_tests.insert(match.tests.begin(), match.tests.end());
                }
            }